

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

Upnp_Handle_Type
GetDeviceHandleInfo(UpnpDevice_Handle start,int AddressFamily,UpnpDevice_Handle *device_handle_out,
                   Handle_Info **HndInfo)

{
  Upnp_Handle_Type UVar1;
  Handle_Info **HndInfo_local;
  UpnpDevice_Handle *device_handle_out_local;
  int AddressFamily_local;
  UpnpDevice_Handle start_local;
  
  if (((AddressFamily == 2) && (UpnpSdkDeviceRegisteredV4 == 0)) ||
     ((AddressFamily == 10 && (UpnpSdkDeviceregisteredV6 == 0)))) {
    *device_handle_out = -1;
  }
  else if ((start < 0) || (0xc6 < start)) {
    *device_handle_out = -1;
  }
  else {
    *device_handle_out = start + 1;
    while (*device_handle_out < 200) {
      UVar1 = GetHandleInfo(*device_handle_out,HndInfo);
      if ((UVar1 == HND_DEVICE) && ((*HndInfo)->DeviceAf == AddressFamily)) {
        return HND_DEVICE;
      }
      *device_handle_out = *device_handle_out + 1;
    }
    *device_handle_out = -1;
  }
  return HND_INVALID;
}

Assistant:

Upnp_Handle_Type GetDeviceHandleInfo(UpnpDevice_Handle start,
	int AddressFamily,
	UpnpDevice_Handle *device_handle_out,
	struct Handle_Info **HndInfo)
{
#ifdef INCLUDE_DEVICE_APIS
	/* Check if we've got a registered device of the address family
	 * specified. */
	if ((AddressFamily == AF_INET && UpnpSdkDeviceRegisteredV4 == 0) ||
		(AddressFamily == AF_INET6 && UpnpSdkDeviceregisteredV6 == 0)) {
		*device_handle_out = -1;
		return HND_INVALID;
	}
	if (start < 0 || start >= NUM_HANDLE - 1) {
		*device_handle_out = -1;
		return HND_INVALID;
	}
	++start;
	/* Find it. */
	for (*device_handle_out = start; *device_handle_out < NUM_HANDLE;
		(*device_handle_out)++) {
		switch (GetHandleInfo(*device_handle_out, HndInfo)) {
		case HND_DEVICE:
			if ((*HndInfo)->DeviceAf == AddressFamily) {
				return HND_DEVICE;
			}
			break;
		default:
			break;
		}
	}
#endif /* INCLUDE_DEVICE_APIS */

	*device_handle_out = -1;
	return HND_INVALID;
}